

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O3

bool __thiscall Trie::buildClue(Trie *this)

{
  _Rb_tree_header *p_Var1;
  undefined2 uVar2;
  mapped_type ptVar3;
  mapped_type *pptVar4;
  mapped_type ptVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  trie_node_t *ptVar9;
  _Self __tmp;
  bool bVar10;
  trie_node_t *child;
  queue<trie_node_s_*,_std::deque<trie_node_s_*,_std::allocator<trie_node_s_*>_>_> Queue;
  undefined2 local_92;
  trie_node_s *local_90;
  _Deque_base<trie_node_s_*,_std::allocator<trie_node_s_*>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<trie_node_s_*,_std::allocator<trie_node_s_*>_>::_M_initialize_map(&local_88,0);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<trie_node_s*,std::allocator<trie_node_s*>>::_M_push_back_aux<trie_node_s*const&>
              ((deque<trie_node_s*,std::allocator<trie_node_s*>> *)&local_88,&this->root);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = this->root;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      ptVar3 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      if ((ptVar3->nextMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        for (p_Var6 = (ptVar3->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(ptVar3->nextMap)._M_t._M_impl.super__Rb_tree_header;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          local_90 = (trie_node_s *)p_Var6[1]._M_parent;
          if (local_90 != (trie_node_s *)0x0) {
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<trie_node_s*,std::allocator<trie_node_s*>>::
              _M_push_back_aux<trie_node_s*const&>
                        ((deque<trie_node_s*,std::allocator<trie_node_s*>> *)&local_88,&local_90);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            ptVar5 = this->root;
            if ((ptVar3 != ptVar5) && (ptVar9 = ptVar3->search_clue, ptVar9 != (trie_node_t *)0x0))
            {
              uVar2 = (undefined2)p_Var6[1]._M_color;
              do {
                p_Var7 = (ptVar9->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                if (p_Var7 != (_Base_ptr)0x0) {
                  p_Var1 = &(ptVar9->nextMap)._M_t._M_impl.super__Rb_tree_header;
                  p_Var8 = &p_Var1->_M_header;
                  do {
                    bVar10 = (ushort)(short)p_Var7[1]._M_color < (ushort)uVar2;
                    if (!bVar10) {
                      p_Var8 = p_Var7;
                    }
                    p_Var7 = (&p_Var7->_M_left)[bVar10];
                  } while (p_Var7 != (_Base_ptr)0x0);
                  if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
                     ((ushort)(short)p_Var8[1]._M_color <= (ushort)uVar2)) {
                    local_92 = uVar2;
                    pptVar4 = std::
                              map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                              ::operator[](&ptVar9->nextMap,&local_92);
                    ptVar5 = *pptVar4;
                    break;
                  }
                }
                ptVar9 = ptVar9->search_clue;
              } while (ptVar9 != (trie_node_t *)0x0);
            }
            local_90->search_clue = ptVar5;
          }
        }
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<trie_node_s_*,_std::allocator<trie_node_s_*>_>::~_Deque_base(&local_88);
  return true;
}

Assistant:

bool Trie::buildClue()
{
	queue<trie_node_t*> Queue;
	auto iter = root->nextMap.begin();
	int i, head = 0, tail = 0;
	trie_node_t *clue = root, *out, *child;
	Queue.push(root);
	while ( ! Queue.empty() ) {
		out = Queue.front();
		Queue.pop();
		if (out->nextMap.empty()) {
			continue;
		}
		for (iter = out->nextMap.begin(); iter != out->nextMap.end(); iter++) {
			child = iter->second;
			if (child != NULL) {
				Queue.push(child);
				if (out == root) {
					child->search_clue = root;
					continue;
				}
				clue = out->search_clue;
				i = iter->first;
				while (clue) {
					if (clue->nextMap.find(i) != clue->nextMap.end()) {
						child->search_clue = clue->nextMap[i];
						break;
					}
					clue = clue->search_clue;
				}
				if (clue == NULL) {
					child->search_clue = root;
				}
			}
		}
	}
	return true;
}